

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O1

int __thiscall SocketInternals::FlushRecv(SocketInternals *this)

{
  int iVar1;
  int iVar2;
  uchar buffer [20];
  uchar auStack_38 [32];
  
  iVar2 = -1;
  do {
    iVar1 = Recv(this,auStack_38,0x14,0.0);
    iVar2 = iVar2 + 1;
  } while (0 < iVar1);
  return iVar2;
}

Assistant:

int SocketInternals::FlushRecv(void)
{
    unsigned char buffer[FW_QRESPONSE_SIZE];
    int numFlushed = 0;
    // If the packet is larger than FW_QRESPONSE_SIZE, the excess bytes will be discarded.
    while (Recv(buffer, FW_QRESPONSE_SIZE, 0.0) > 0)
        numFlushed++;
    return numFlushed;
}